

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereBoxCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSphereBoxCollisionAlgorithm::processCollision
          (btSphereBoxCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  btCollisionObjectWrapper *boxObjWrap;
  btScalar maxContactDistance;
  btScalar penetrationDepth;
  btVector3 normalOnSurfaceB;
  btVector3 pOnBox;
  btVector3 sphereCenter;
  btScalar local_5c;
  btVector3 local_58;
  btVector3 local_48;
  btVector3 local_38;
  
  if (this->m_manifoldPtr != (btPersistentManifold *)0x0) {
    boxObjWrap = body1Wrap;
    if (this->m_isSwapped != false) {
      boxObjWrap = body0Wrap;
      body0Wrap = body1Wrap;
    }
    local_38.m_floats._0_8_ = *(undefined8 *)(body0Wrap->m_worldTransform->m_origin).m_floats;
    local_38.m_floats._8_8_ = *(undefined8 *)((body0Wrap->m_worldTransform->m_origin).m_floats + 2);
    fVar1 = *(float *)&body0Wrap->m_shape[1].field_0xc;
    fVar2 = *(float *)&body0Wrap->m_shape->field_0x1c;
    maxContactDistance = btPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    bVar3 = getSphereDistance(this,boxObjWrap,&local_48,&local_58,&local_5c,&local_38,fVar1 * fVar2,
                              maxContactDistance);
    if (bVar3) {
      (*(resultOut->super_Result)._vptr_Result[4])(local_5c,resultOut,&local_58,&local_48);
    }
    if ((this->m_ownManifold == true) && (this->m_manifoldPtr->m_cachedPoints != 0)) {
      btManifoldResult::refreshContactPoints(resultOut);
    }
  }
  return;
}

Assistant:

void btSphereBoxCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap, const btCollisionObjectWrapper* body1Wrap, const btDispatcherInfo& dispatchInfo, btManifoldResult* resultOut)
{
	(void)dispatchInfo;
	(void)resultOut;
	if (!m_manifoldPtr)
		return;

	const btCollisionObjectWrapper* sphereObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* boxObjWrap = m_isSwapped? body0Wrap : body1Wrap;

	btVector3 pOnBox;

	btVector3 normalOnSurfaceB;
	btScalar penetrationDepth;
	btVector3 sphereCenter = sphereObjWrap->getWorldTransform().getOrigin();
	const btSphereShape* sphere0 = (const btSphereShape*)sphereObjWrap->getCollisionShape();
	btScalar radius = sphere0->getRadius();
	btScalar maxContactDistance = m_manifoldPtr->getContactBreakingThreshold();

	resultOut->setPersistentManifold(m_manifoldPtr);

	if (getSphereDistance(boxObjWrap, pOnBox, normalOnSurfaceB, penetrationDepth, sphereCenter, radius, maxContactDistance))
	{
		/// report a contact. internally this will be kept persistent, and contact reduction is done
		resultOut->addContactPoint(normalOnSurfaceB, pOnBox, penetrationDepth);
	}

	if (m_ownManifold)
	{
		if (m_manifoldPtr->getNumContacts())
		{
			resultOut->refreshContactPoints();
		}
	}

}